

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  AABBNodeMB4D *node1;
  ulong uVar17;
  long lVar18;
  NodeRef *pNVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float *vertices;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar55;
  float fVar56;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  uint uVar72;
  uint uVar73;
  uint uVar74;
  undefined1 auVar71 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  NodeRef *local_1570;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 *local_1518;
  ulong local_1510;
  NodeRef *local_1508;
  Scene *scene;
  ulong local_14f8;
  ulong local_14f0;
  ulong local_14e8;
  ulong local_14e0;
  ulong local_14d8;
  ulong local_14d0;
  ulong local_14c8;
  ulong local_14c0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_12f8 [16];
  float local_12e8 [4];
  undefined1 local_12d8 [16];
  float local_12c8 [4];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  RTCHitN local_1288 [16];
  undefined4 local_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 local_1268;
  undefined4 uStack_1264;
  undefined4 uStack_1260;
  undefined4 uStack_125c;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  uint local_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  uint uStack_1200;
  uint uStack_11fc;
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar62._4_4_ = fVar52;
  auVar62._0_4_ = fVar52;
  auVar62._8_4_ = fVar52;
  auVar62._12_4_ = fVar52;
  auVar62._16_4_ = fVar52;
  auVar62._20_4_ = fVar52;
  auVar62._24_4_ = fVar52;
  auVar62._28_4_ = fVar52;
  fVar55 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar63._4_4_ = fVar55;
  auVar63._0_4_ = fVar55;
  auVar63._8_4_ = fVar55;
  auVar63._12_4_ = fVar55;
  auVar63._16_4_ = fVar55;
  auVar63._20_4_ = fVar55;
  auVar63._24_4_ = fVar55;
  auVar63._28_4_ = fVar55;
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar67._4_4_ = fVar56;
  auVar67._0_4_ = fVar56;
  auVar67._8_4_ = fVar56;
  auVar67._12_4_ = fVar56;
  auVar67._16_4_ = fVar56;
  auVar67._20_4_ = fVar56;
  auVar67._24_4_ = fVar56;
  auVar67._28_4_ = fVar56;
  fVar52 = fVar52 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar55 = fVar55 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar56 = fVar56 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_14c8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_14d0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_14d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_14e0 = local_14c8 ^ 0x20;
  local_14e8 = local_14d0 ^ 0x20;
  local_14f0 = local_14d8 ^ 0x20;
  auVar70._0_8_ = CONCAT44(fVar52,fVar52) ^ 0x8000000080000000;
  auVar70._8_4_ = -fVar52;
  auVar70._12_4_ = -fVar52;
  auVar70._16_4_ = -fVar52;
  auVar70._20_4_ = -fVar52;
  auVar70._24_4_ = -fVar52;
  auVar70._28_4_ = -fVar52;
  auVar71._0_8_ = CONCAT44(fVar55,fVar55) ^ 0x8000000080000000;
  auVar71._8_4_ = -fVar55;
  auVar71._12_4_ = -fVar55;
  auVar71._16_4_ = -fVar55;
  auVar71._20_4_ = -fVar55;
  auVar71._24_4_ = -fVar55;
  auVar71._28_4_ = -fVar55;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar77._4_4_ = iVar2;
  auVar77._0_4_ = iVar2;
  auVar77._8_4_ = iVar2;
  auVar77._12_4_ = iVar2;
  auVar77._16_4_ = iVar2;
  auVar77._20_4_ = iVar2;
  auVar77._24_4_ = iVar2;
  auVar77._28_4_ = iVar2;
  auVar79._0_8_ = CONCAT44(fVar56,fVar56) ^ 0x8000000080000000;
  auVar79._8_4_ = -fVar56;
  auVar79._12_4_ = -fVar56;
  auVar79._16_4_ = -fVar56;
  auVar79._20_4_ = -fVar56;
  auVar79._24_4_ = -fVar56;
  auVar79._28_4_ = -fVar56;
  iVar2 = (tray->tfar).field_0.i[k];
  local_11f8._4_4_ = iVar2;
  local_11f8._0_4_ = iVar2;
  local_11f8._8_4_ = iVar2;
  local_11f8._12_4_ = iVar2;
  local_11f8._16_4_ = iVar2;
  local_11f8._20_4_ = iVar2;
  local_11f8._24_4_ = iVar2;
  local_11f8._28_4_ = iVar2;
  local_1518 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar19 = stack + 1;
  do {
    local_1508 = pNVar19;
    if (pNVar19 == stack) break;
    local_1570 = pNVar19 + -1;
    sVar30 = pNVar19[-1].ptr;
    do {
      if ((sVar30 & 8) == 0) {
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar45._4_4_ = uVar3;
        auVar45._0_4_ = uVar3;
        auVar45._8_4_ = uVar3;
        auVar45._12_4_ = uVar3;
        auVar45._16_4_ = uVar3;
        auVar45._20_4_ = uVar3;
        auVar45._24_4_ = uVar3;
        auVar45._28_4_ = uVar3;
        uVar17 = sVar30 & 0xfffffffffffffff0;
        auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14c8),auVar45,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14c8));
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14d0),auVar45,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14d0));
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar70);
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar63,auVar71);
        auVar7 = vpmaxsd_avx2(ZEXT1632(auVar37),ZEXT1632(auVar42));
        auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14d8),auVar45,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14d8));
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar67,auVar79);
        auVar8 = vpmaxsd_avx2(ZEXT1632(auVar37),auVar77);
        auVar7 = vpmaxsd_avx2(auVar7,auVar8);
        auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14e0),auVar45,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14e0));
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar70);
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14e8),auVar45,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14e8));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar63,auVar71);
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14f0),auVar45,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14f0));
        auVar8 = vpminsd_avx2(ZEXT1632(auVar37),ZEXT1632(auVar42));
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar67,auVar79);
        auVar9 = vpminsd_avx2(ZEXT1632(auVar37),local_11f8);
        auVar8 = vpminsd_avx2(auVar8,auVar9);
        auVar7 = vcmpps_avx(auVar7,auVar8,2);
        if (((uint)sVar30 & 7) == 6) {
          auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar17 + 0x1c0),auVar45,2);
          auVar9 = vcmpps_avx(auVar45,*(undefined1 (*) [32])(uVar17 + 0x1e0),1);
          auVar8 = vandps_avx(auVar8,auVar9);
          auVar7 = vandps_avx(auVar8,auVar7);
          auVar37 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
        }
        else {
          auVar37 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
        }
        auVar37 = vpsllw_avx(auVar37,0xf);
        auVar37 = vpacksswb_avx(auVar37,auVar37);
        local_1510 = (ulong)(byte)(SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar37 >> 0x3f,0) << 7);
      }
      if ((sVar30 & 8) == 0) {
        if (local_1510 == 0) {
          uVar32 = 4;
        }
        else {
          uVar29 = sVar30 & 0xfffffffffffffff0;
          lVar10 = 0;
          for (uVar17 = local_1510; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar32 = 0;
          sVar30 = *(size_t *)(uVar29 + lVar10 * 8);
          for (uVar17 = local_1510 - 1 & local_1510; uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
            local_1570->ptr = sVar30;
            local_1570 = local_1570 + 1;
            lVar10 = 0;
            for (uVar34 = uVar17; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              lVar10 = lVar10 + 1;
            }
            sVar30 = *(size_t *)(uVar29 + lVar10 * 8);
          }
        }
      }
      else {
        uVar32 = 6;
      }
    } while (uVar32 == 0);
    if (uVar32 == 6) {
      uVar32 = 0;
      local_14f8 = (ulong)((uint)sVar30 & 0xf) - 8;
      bVar35 = local_14f8 != 0;
      if (bVar35) {
        uVar29 = sVar30 & 0xfffffffffffffff0;
        uVar17 = 0;
        do {
          lVar18 = uVar17 * 0x50;
          scene = context->scene;
          pGVar5 = (scene->geometries).items[*(uint *)(uVar29 + 0x30 + lVar18)].ptr;
          fVar52 = (pGVar5->time_range).lower;
          fVar52 = pGVar5->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar52) /
                   ((pGVar5->time_range).upper - fVar52));
          auVar37 = vroundss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),9);
          auVar37 = vminss_avx(auVar37,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
          auVar48 = vmaxss_avx(ZEXT816(0),auVar37);
          lVar22 = (long)(int)auVar48._0_4_ * 0x38;
          uVar34 = (ulong)*(uint *)(uVar29 + 4 + lVar18);
          lVar10 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar22);
          lVar22 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar22);
          auVar37 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar29 + lVar18) * 4);
          uVar33 = (ulong)*(uint *)(uVar29 + 0x10 + lVar18);
          auVar42 = *(undefined1 (*) [16])(lVar10 + uVar33 * 4);
          uVar20 = (ulong)*(uint *)(uVar29 + 0x20 + lVar18);
          auVar59 = *(undefined1 (*) [16])(lVar10 + uVar20 * 4);
          auVar38 = *(undefined1 (*) [16])(lVar10 + uVar34 * 4);
          uVar24 = (ulong)*(uint *)(uVar29 + 0x14 + lVar18);
          auVar54 = *(undefined1 (*) [16])(lVar10 + uVar24 * 4);
          uVar23 = (ulong)*(uint *)(uVar29 + 0x24 + lVar18);
          auVar66 = *(undefined1 (*) [16])(lVar10 + uVar23 * 4);
          uVar31 = (ulong)*(uint *)(uVar29 + 8 + lVar18);
          auVar46 = *(undefined1 (*) [16])(lVar10 + uVar31 * 4);
          uVar27 = (ulong)*(uint *)(uVar29 + 0x18 + lVar18);
          auVar65 = *(undefined1 (*) [16])(lVar10 + uVar27 * 4);
          uVar25 = (ulong)*(uint *)(uVar29 + 0x28 + lVar18);
          auVar47 = *(undefined1 (*) [16])(lVar10 + uVar25 * 4);
          uVar21 = (ulong)*(uint *)(uVar29 + 0xc + lVar18);
          auVar49 = *(undefined1 (*) [16])(lVar10 + uVar21 * 4);
          uVar28 = (ulong)*(uint *)(uVar29 + 0x1c + lVar18);
          auVar39 = *(undefined1 (*) [16])(lVar10 + uVar28 * 4);
          uVar26 = (ulong)*(uint *)(uVar29 + 0x2c + lVar18);
          auVar40 = *(undefined1 (*) [16])(lVar10 + uVar26 * 4);
          auVar41 = *(undefined1 (*) [16])(lVar22 + (ulong)*(uint *)(uVar29 + lVar18) * 4);
          auVar61 = *(undefined1 (*) [16])(lVar22 + uVar33 * 4);
          fVar52 = fVar52 - auVar48._0_4_;
          auVar48 = vunpcklps_avx(auVar37,auVar46);
          auVar46 = vunpckhps_avx(auVar37,auVar46);
          auVar64 = vunpcklps_avx(auVar38,auVar49);
          auVar38 = vunpckhps_avx(auVar38,auVar49);
          auVar37 = *(undefined1 (*) [16])(lVar22 + uVar34 * 4);
          auVar53 = vunpcklps_avx(auVar46,auVar38);
          auVar58 = vunpcklps_avx(auVar48,auVar64);
          auVar46 = vunpckhps_avx(auVar48,auVar64);
          auVar49 = vunpcklps_avx(auVar42,auVar65);
          auVar38 = vunpckhps_avx(auVar42,auVar65);
          auVar65 = vunpcklps_avx(auVar54,auVar39);
          auVar54 = vunpckhps_avx(auVar54,auVar39);
          auVar42 = *(undefined1 (*) [16])(lVar22 + uVar31 * 4);
          auVar39 = vunpcklps_avx(auVar38,auVar54);
          auVar48 = vunpcklps_avx(auVar49,auVar65);
          auVar54 = vunpckhps_avx(auVar49,auVar65);
          auVar49 = vunpcklps_avx(auVar59,auVar47);
          auVar65 = vunpckhps_avx(auVar59,auVar47);
          auVar64 = vunpcklps_avx(auVar66,auVar40);
          auVar47 = vunpckhps_avx(auVar66,auVar40);
          auVar38 = *(undefined1 (*) [16])(lVar22 + uVar21 * 4);
          auVar40 = vunpcklps_avx(auVar65,auVar47);
          auVar59 = vunpcklps_avx(auVar49,auVar64);
          auVar65 = vunpckhps_avx(auVar49,auVar64);
          auVar47 = vunpcklps_avx(auVar41,auVar42);
          auVar42 = vunpckhps_avx(auVar41,auVar42);
          auVar49 = vunpcklps_avx(auVar37,auVar38);
          auVar38 = vunpckhps_avx(auVar37,auVar38);
          auVar37 = *(undefined1 (*) [16])(lVar22 + uVar27 * 4);
          auVar41 = vunpcklps_avx(auVar42,auVar38);
          auVar64 = vunpcklps_avx(auVar47,auVar49);
          auVar38 = vunpckhps_avx(auVar47,auVar49);
          auVar49 = vunpcklps_avx(auVar61,auVar37);
          auVar47 = vunpckhps_avx(auVar61,auVar37);
          auVar37 = *(undefined1 (*) [16])(lVar22 + uVar24 * 4);
          auVar42 = *(undefined1 (*) [16])(lVar22 + uVar28 * 4);
          auVar61 = vunpcklps_avx(auVar37,auVar42);
          auVar37 = vunpckhps_avx(auVar37,auVar42);
          auVar66 = vunpcklps_avx(auVar47,auVar37);
          auVar69 = vunpcklps_avx(auVar49,auVar61);
          auVar47 = vunpckhps_avx(auVar49,auVar61);
          auVar37 = *(undefined1 (*) [16])(lVar22 + uVar20 * 4);
          auVar42 = *(undefined1 (*) [16])(lVar22 + uVar25 * 4);
          auVar61 = vunpcklps_avx(auVar37,auVar42);
          auVar49 = vunpckhps_avx(auVar37,auVar42);
          auVar37 = *(undefined1 (*) [16])(lVar22 + uVar23 * 4);
          auVar42 = *(undefined1 (*) [16])(lVar22 + uVar26 * 4);
          auVar68 = vunpcklps_avx(auVar37,auVar42);
          auVar37 = vunpckhps_avx(auVar37,auVar42);
          auVar42 = vunpcklps_avx(auVar49,auVar37);
          auVar49 = vunpcklps_avx(auVar61,auVar68);
          auVar37 = vunpckhps_avx(auVar61,auVar68);
          fVar55 = 1.0 - fVar52;
          auVar80._4_4_ = fVar55;
          auVar80._0_4_ = fVar55;
          auVar80._8_4_ = fVar55;
          auVar80._12_4_ = fVar55;
          auVar61._0_4_ = fVar52 * auVar64._0_4_;
          auVar61._4_4_ = fVar52 * auVar64._4_4_;
          auVar61._8_4_ = fVar52 * auVar64._8_4_;
          auVar61._12_4_ = fVar52 * auVar64._12_4_;
          auVar61 = vfmadd231ps_fma(auVar61,auVar80,auVar58);
          auVar64._0_4_ = fVar52 * auVar38._0_4_;
          auVar64._4_4_ = fVar52 * auVar38._4_4_;
          auVar64._8_4_ = fVar52 * auVar38._8_4_;
          auVar64._12_4_ = fVar52 * auVar38._12_4_;
          auVar64 = vfmadd231ps_fma(auVar64,auVar80,auVar46);
          auVar68._0_4_ = fVar52 * auVar41._0_4_;
          auVar68._4_4_ = fVar52 * auVar41._4_4_;
          auVar68._8_4_ = fVar52 * auVar41._8_4_;
          auVar68._12_4_ = fVar52 * auVar41._12_4_;
          auVar41 = vfmadd231ps_fma(auVar68,auVar80,auVar53);
          auVar38._0_4_ = fVar52 * auVar69._0_4_;
          auVar38._4_4_ = fVar52 * auVar69._4_4_;
          auVar38._8_4_ = fVar52 * auVar69._8_4_;
          auVar38._12_4_ = fVar52 * auVar69._12_4_;
          auVar38 = vfmadd231ps_fma(auVar38,auVar80,auVar48);
          auVar46._0_4_ = fVar52 * auVar47._0_4_;
          auVar46._4_4_ = fVar52 * auVar47._4_4_;
          auVar46._8_4_ = fVar52 * auVar47._8_4_;
          auVar46._12_4_ = fVar52 * auVar47._12_4_;
          auVar54 = vfmadd231ps_fma(auVar46,auVar80,auVar54);
          auVar48._0_4_ = fVar52 * auVar66._0_4_;
          auVar48._4_4_ = fVar52 * auVar66._4_4_;
          auVar48._8_4_ = fVar52 * auVar66._8_4_;
          auVar48._12_4_ = fVar52 * auVar66._12_4_;
          auVar46 = vfmadd231ps_fma(auVar48,auVar80,auVar39);
          puVar1 = (undefined8 *)(uVar29 + 0x30 + lVar18);
          local_1358 = *puVar1;
          uStack_1350 = puVar1[1];
          puVar1 = (undefined8 *)(uVar29 + 0x40 + lVar18);
          auVar58._0_4_ = fVar52 * auVar49._0_4_;
          auVar58._4_4_ = fVar52 * auVar49._4_4_;
          auVar58._8_4_ = fVar52 * auVar49._8_4_;
          auVar58._12_4_ = fVar52 * auVar49._12_4_;
          auVar75._0_4_ = fVar52 * auVar37._0_4_;
          auVar75._4_4_ = fVar52 * auVar37._4_4_;
          auVar75._8_4_ = fVar52 * auVar37._8_4_;
          auVar75._12_4_ = fVar52 * auVar37._12_4_;
          auVar82._0_4_ = fVar52 * auVar42._0_4_;
          auVar82._4_4_ = fVar52 * auVar42._4_4_;
          auVar82._8_4_ = fVar52 * auVar42._8_4_;
          auVar82._12_4_ = fVar52 * auVar42._12_4_;
          auVar47 = vfmadd231ps_fma(auVar58,auVar80,auVar59);
          auVar65 = vfmadd231ps_fma(auVar75,auVar80,auVar65);
          auVar49 = vfmadd231ps_fma(auVar82,auVar80,auVar40);
          local_1368 = *puVar1;
          uStack_1360 = puVar1[1];
          auVar42 = vsubps_avx(auVar61,auVar38);
          auVar37 = vsubps_avx(auVar64,auVar54);
          auVar38 = vsubps_avx(auVar41,auVar46);
          auVar54 = vsubps_avx(auVar47,auVar61);
          auVar46 = vsubps_avx(auVar65,auVar64);
          auVar65 = vsubps_avx(auVar49,auVar41);
          auVar47._0_4_ = auVar37._0_4_ * auVar65._0_4_;
          auVar47._4_4_ = auVar37._4_4_ * auVar65._4_4_;
          auVar47._8_4_ = auVar37._8_4_ * auVar65._8_4_;
          auVar47._12_4_ = auVar37._12_4_ * auVar65._12_4_;
          local_12b8 = vfmsub231ps_fma(auVar47,auVar46,auVar38);
          auVar53._0_4_ = auVar38._0_4_ * auVar54._0_4_;
          auVar53._4_4_ = auVar38._4_4_ * auVar54._4_4_;
          auVar53._8_4_ = auVar38._8_4_ * auVar54._8_4_;
          auVar53._12_4_ = auVar38._12_4_ * auVar54._12_4_;
          local_12a8 = vfmsub231ps_fma(auVar53,auVar65,auVar42);
          uVar3 = *(undefined4 *)(ray + k * 4);
          auVar49._4_4_ = uVar3;
          auVar49._0_4_ = uVar3;
          auVar49._8_4_ = uVar3;
          auVar49._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar59._4_4_ = uVar3;
          auVar59._0_4_ = uVar3;
          auVar59._8_4_ = uVar3;
          auVar59._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar39._4_4_ = uVar3;
          auVar39._0_4_ = uVar3;
          auVar39._8_4_ = uVar3;
          auVar39._12_4_ = uVar3;
          fVar52 = *(float *)(ray + k * 4 + 0x40);
          auVar81._4_4_ = fVar52;
          auVar81._0_4_ = fVar52;
          auVar81._8_4_ = fVar52;
          auVar81._12_4_ = fVar52;
          auVar47 = vsubps_avx(auVar61,auVar49);
          fVar55 = *(float *)(ray + k * 4 + 0x50);
          auVar83._4_4_ = fVar55;
          auVar83._0_4_ = fVar55;
          auVar83._8_4_ = fVar55;
          auVar83._12_4_ = fVar55;
          auVar49 = vsubps_avx(auVar64,auVar59);
          fVar56 = *(float *)(ray + k * 4 + 0x60);
          auVar84._4_4_ = fVar56;
          auVar84._0_4_ = fVar56;
          auVar84._8_4_ = fVar56;
          auVar84._12_4_ = fVar56;
          auVar39 = vsubps_avx(auVar41,auVar39);
          auVar40._0_4_ = fVar52 * auVar49._0_4_;
          auVar40._4_4_ = fVar52 * auVar49._4_4_;
          auVar40._8_4_ = fVar52 * auVar49._8_4_;
          auVar40._12_4_ = fVar52 * auVar49._12_4_;
          auVar40 = vfmsub231ps_fma(auVar40,auVar47,auVar83);
          auVar69._0_4_ = auVar65._0_4_ * auVar40._0_4_;
          auVar69._4_4_ = auVar65._4_4_ * auVar40._4_4_;
          auVar69._8_4_ = auVar65._8_4_ * auVar40._8_4_;
          auVar69._12_4_ = auVar65._12_4_ * auVar40._12_4_;
          auVar41._0_4_ = auVar38._0_4_ * auVar40._0_4_;
          auVar41._4_4_ = auVar38._4_4_ * auVar40._4_4_;
          auVar41._8_4_ = auVar38._8_4_ * auVar40._8_4_;
          auVar41._12_4_ = auVar38._12_4_ * auVar40._12_4_;
          auVar65._0_4_ = fVar56 * auVar47._0_4_;
          auVar65._4_4_ = fVar56 * auVar47._4_4_;
          auVar65._8_4_ = fVar56 * auVar47._8_4_;
          auVar65._12_4_ = fVar56 * auVar47._12_4_;
          auVar65 = vfmsub231ps_fma(auVar65,auVar39,auVar81);
          auVar38 = vfmadd231ps_fma(auVar69,auVar65,auVar46);
          auVar65 = vfmadd231ps_fma(auVar41,auVar37,auVar65);
          auVar66._0_4_ = auVar46._0_4_ * auVar42._0_4_;
          auVar66._4_4_ = auVar46._4_4_ * auVar42._4_4_;
          auVar66._8_4_ = auVar46._8_4_ * auVar42._8_4_;
          auVar66._12_4_ = auVar46._12_4_ * auVar42._12_4_;
          local_1298 = vfmsub231ps_fma(auVar66,auVar54,auVar37);
          auVar76._0_4_ = fVar55 * auVar39._0_4_;
          auVar76._4_4_ = fVar55 * auVar39._4_4_;
          auVar76._8_4_ = fVar55 * auVar39._8_4_;
          auVar76._12_4_ = fVar55 * auVar39._12_4_;
          auVar40 = vfmsub231ps_fma(auVar76,auVar49,auVar84);
          auVar78._0_4_ = fVar56 * local_1298._0_4_;
          auVar78._4_4_ = fVar56 * local_1298._4_4_;
          auVar78._8_4_ = fVar56 * local_1298._8_4_;
          auVar78._12_4_ = fVar56 * local_1298._12_4_;
          auVar37 = vfmadd231ps_fma(auVar78,local_12a8,auVar83);
          auVar46 = vfmadd231ps_fma(auVar37,local_12b8,auVar81);
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
          auVar38 = vfmadd231ps_fma(auVar38,auVar40,auVar54);
          auVar37 = vandps_avx(auVar46,auVar37);
          uVar32 = auVar37._0_4_;
          local_1348._0_4_ = (float)(uVar32 ^ auVar38._0_4_);
          uVar72 = auVar37._4_4_;
          local_1348._4_4_ = (float)(uVar72 ^ auVar38._4_4_);
          uVar73 = auVar37._8_4_;
          local_1348._8_4_ = (float)(uVar73 ^ auVar38._8_4_);
          uVar74 = auVar37._12_4_;
          local_1348._12_4_ = (float)(uVar74 ^ auVar38._12_4_);
          auVar37 = vfmadd231ps_fma(auVar65,auVar42,auVar40);
          local_1338._0_4_ = (float)(uVar32 ^ auVar37._0_4_);
          local_1338._4_4_ = (float)(uVar72 ^ auVar37._4_4_);
          local_1338._8_4_ = (float)(uVar73 ^ auVar37._8_4_);
          local_1338._12_4_ = (float)(uVar74 ^ auVar37._12_4_);
          auVar38 = ZEXT816(0) << 0x20;
          auVar37 = vcmpps_avx(local_1348,auVar38,5);
          auVar42 = vcmpps_avx(local_1338,auVar38,5);
          auVar37 = vandps_avx(auVar37,auVar42);
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          local_1318 = vandps_avx(auVar46,auVar54);
          auVar42 = vcmpps_avx(auVar46,auVar38,4);
          auVar37 = vandps_avx(auVar42,auVar37);
          auVar42._0_4_ = local_1338._0_4_ + local_1348._0_4_;
          auVar42._4_4_ = local_1338._4_4_ + local_1348._4_4_;
          auVar42._8_4_ = local_1338._8_4_ + local_1348._8_4_;
          auVar42._12_4_ = local_1338._12_4_ + local_1348._12_4_;
          auVar42 = vcmpps_avx(auVar42,local_1318,2);
          auVar38 = auVar42 & auVar37;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar37 = vandps_avx(auVar37,auVar42);
            auVar43._0_4_ = local_1298._0_4_ * auVar39._0_4_;
            auVar43._4_4_ = local_1298._4_4_ * auVar39._4_4_;
            auVar43._8_4_ = local_1298._8_4_ * auVar39._8_4_;
            auVar43._12_4_ = local_1298._12_4_ * auVar39._12_4_;
            auVar42 = vfmadd213ps_fma(auVar49,local_12a8,auVar43);
            auVar42 = vfmadd213ps_fma(auVar47,local_12b8,auVar42);
            local_1328._0_4_ = (float)(uVar32 ^ auVar42._0_4_);
            local_1328._4_4_ = (float)(uVar72 ^ auVar42._4_4_);
            local_1328._8_4_ = (float)(uVar73 ^ auVar42._8_4_);
            local_1328._12_4_ = (float)(uVar74 ^ auVar42._12_4_);
            fVar52 = *(float *)(ray + k * 4 + 0x30);
            auVar44._0_4_ = local_1318._0_4_ * fVar52;
            auVar44._4_4_ = local_1318._4_4_ * fVar52;
            auVar44._8_4_ = local_1318._8_4_ * fVar52;
            auVar44._12_4_ = local_1318._12_4_ * fVar52;
            auVar42 = vcmpps_avx(auVar44,local_1328,1);
            fVar52 = *(float *)(ray + k * 4 + 0x80);
            auVar60._0_4_ = local_1318._0_4_ * fVar52;
            auVar60._4_4_ = local_1318._4_4_ * fVar52;
            auVar60._8_4_ = local_1318._8_4_ * fVar52;
            auVar60._12_4_ = local_1318._12_4_ * fVar52;
            auVar38 = vcmpps_avx(local_1328,auVar60,2);
            auVar42 = vandps_avx(auVar42,auVar38);
            auVar38 = auVar37 & auVar42;
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              local_12f8 = vandps_avx(auVar37,auVar42);
              auVar37 = vrcpps_avx(local_1318);
              auVar50._8_4_ = 0x3f800000;
              auVar50._0_8_ = &DAT_3f8000003f800000;
              auVar50._12_4_ = 0x3f800000;
              auVar42 = vfnmadd213ps_fma(local_1318,auVar37,auVar50);
              auVar37 = vfmadd132ps_fma(auVar42,auVar37,auVar37);
              fVar52 = auVar37._0_4_;
              fVar55 = auVar37._4_4_;
              fVar56 = auVar37._8_4_;
              fVar57 = auVar37._12_4_;
              local_12c8[0] = fVar52 * local_1328._0_4_;
              local_12c8[1] = fVar55 * local_1328._4_4_;
              local_12c8[2] = fVar56 * local_1328._8_4_;
              local_12c8[3] = fVar57 * local_1328._12_4_;
              local_12e8[0] = fVar52 * local_1348._0_4_;
              local_12e8[1] = fVar55 * local_1348._4_4_;
              local_12e8[2] = fVar56 * local_1348._8_4_;
              local_12e8[3] = fVar57 * local_1348._12_4_;
              local_12d8._0_4_ = fVar52 * local_1338._0_4_;
              local_12d8._4_4_ = fVar55 * local_1338._4_4_;
              local_12d8._8_4_ = fVar56 * local_1338._8_4_;
              local_12d8._12_4_ = fVar57 * local_1338._12_4_;
              uVar32 = vmovmskps_avx(local_12f8);
              uVar34 = (ulong)uVar32;
              local_14c0 = uVar17;
              do {
                uVar21 = 0;
                for (uVar20 = uVar34; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000)
                {
                  uVar21 = uVar21 + 1;
                }
                uVar32 = *(uint *)((long)&local_1358 + uVar21 * 4);
                pGVar5 = (scene->geometries).items[uVar32].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar34 = uVar34 ^ 1L << (uVar21 & 0x3f);
                  bVar36 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar36 = false;
                }
                else {
                  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar20 = (ulong)(uint)((int)uVar21 * 4);
                  uVar4 = *(undefined4 *)((long)local_12e8 + uVar20);
                  local_1258._4_4_ = uVar4;
                  local_1258._0_4_ = uVar4;
                  local_1258._8_4_ = uVar4;
                  local_1258._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_12d8 + uVar20);
                  local_1248._4_4_ = uVar4;
                  local_1248._0_4_ = uVar4;
                  local_1248._8_4_ = uVar4;
                  local_1248._12_4_ = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12c8 + uVar20);
                  args.context = context->user;
                  local_1228._4_4_ = uVar32;
                  local_1228._0_4_ = uVar32;
                  local_1228._8_4_ = uVar32;
                  local_1228._12_4_ = uVar32;
                  uVar4 = *(undefined4 *)((long)&local_1368 + uVar20);
                  local_1238._4_4_ = uVar4;
                  local_1238._0_4_ = uVar4;
                  local_1238._8_4_ = uVar4;
                  local_1238._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_12b8 + uVar20);
                  local_1278 = *(undefined4 *)(local_12a8 + uVar20);
                  local_1268 = *(undefined4 *)(local_1298 + uVar20);
                  local_1288[0] = (RTCHitN)(char)uVar4;
                  local_1288[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                  local_1288[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                  local_1288[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                  local_1288[4] = (RTCHitN)(char)uVar4;
                  local_1288[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                  local_1288[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                  local_1288[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                  local_1288[8] = (RTCHitN)(char)uVar4;
                  local_1288[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                  local_1288[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                  local_1288[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                  local_1288[0xc] = (RTCHitN)(char)uVar4;
                  local_1288[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                  local_1288[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                  local_1288[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                  uStack_1274 = local_1278;
                  uStack_1270 = local_1278;
                  uStack_126c = local_1278;
                  uStack_1264 = local_1268;
                  uStack_1260 = local_1268;
                  uStack_125c = local_1268;
                  vpcmpeqd_avx2(ZEXT1632(local_1228),ZEXT1632(local_1228));
                  uStack_1214 = (args.context)->instID[0];
                  local_1218 = uStack_1214;
                  uStack_1210 = uStack_1214;
                  uStack_120c = uStack_1214;
                  uStack_1208 = (args.context)->instPrimID[0];
                  uStack_1204 = uStack_1208;
                  uStack_1200 = uStack_1208;
                  uStack_11fc = uStack_1208;
                  local_1528 = *local_1518;
                  uStack_1520 = local_1518[1];
                  args.valid = (int *)&local_1528;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.hit = local_1288;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&args);
                  }
                  auVar15._8_8_ = uStack_1520;
                  auVar15._0_8_ = local_1528;
                  if (auVar15 == (undefined1  [16])0x0) {
                    auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar37 = auVar37 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&args);
                    }
                    auVar16._8_8_ = uStack_1520;
                    auVar16._0_8_ = local_1528;
                    auVar42 = vpcmpeqd_avx((undefined1  [16])0x0,auVar16);
                    auVar37 = auVar42 ^ _DAT_01febe20;
                    auVar51._8_4_ = 0xff800000;
                    auVar51._0_8_ = 0xff800000ff800000;
                    auVar51._12_4_ = 0xff800000;
                    auVar42 = vblendvps_avx(auVar51,*(undefined1 (*) [16])(args.ray + 0x80),auVar42)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar42;
                  }
                  auVar37 = vpslld_avx(auVar37,0x1f);
                  bVar13 = (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar14 = (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar12 = (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar11 = -1 < auVar37[0xf];
                  bVar36 = ((bVar13 && bVar14) && bVar12) && bVar11;
                  if (((bVar13 && bVar14) && bVar12) && bVar11) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar3;
                    uVar34 = uVar34 ^ 1L << (uVar21 & 0x3f);
                  }
                }
                uVar32 = 0;
                if (!bVar36) {
                  if (bVar35) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar32 = 1;
                  }
                  goto LAB_0065334b;
                }
              } while (uVar34 != 0);
            }
          }
          uVar32 = 0;
          uVar17 = uVar17 + 1;
          bVar35 = uVar17 < local_14f8;
        } while (uVar17 != local_14f8);
      }
    }
LAB_0065334b:
    pNVar19 = local_1570;
  } while ((uVar32 & 3) == 0);
  return local_1508 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }